

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isAllowedInPackage(SyntaxKind kind)

{
  SyntaxKind in_EDI;
  bool local_1;
  
  if (((in_EDI == AnonymousProgram) || (in_EDI - PackageExportAllDeclaration < 2)) ||
     (in_EDI == TimeUnitsDeclaration)) {
    local_1 = true;
  }
  else {
    local_1 = isModuleOrPackageDecl(in_EDI);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isAllowedInPackage(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::PackageExportDeclaration:
        case SyntaxKind::PackageExportAllDeclaration:
        case SyntaxKind::AnonymousProgram:
            return true;
        default:
            return isModuleOrPackageDecl(kind);
    }
}